

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

int __thiscall QObject::senderSignalIndex(QObject *this)

{
  QBasicMutex *this_00;
  __pointer_type copy;
  QObjectData *pQVar1;
  QObject *pQVar2;
  int iVar3;
  QObject *pQVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QMetaMethod local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  uVar5 = (ulong)((uint)this & 0xfffffff8) % 0x418;
  this_00 = (QBasicMutex *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar5);
  if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar5) == 0) {
    LOCK();
    bVar6 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar6) {
      (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar6) goto LAB_002b664f;
  }
  QBasicMutex::lockInternal(this_00);
LAB_002b664f:
  pQVar2 = pQVar1[1].parent;
  iVar3 = -1;
  if ((pQVar2 != (QObject *)0x0) && (pQVar1 = pQVar2[1].d_ptr.d, pQVar1 != (QObjectData *)0x0)) {
    pQVar4 = pQVar2 + 1;
    do {
      pQVar4 = (QObject *)pQVar4->_vptr_QObject;
      if (pQVar4 == (QObject *)0x0) goto LAB_002b66a3;
    } while ((QObject *)pQVar4[2]._vptr_QObject != pQVar1->parent);
    iVar3 = (**((QObject *)pQVar4[2]._vptr_QObject)->_vptr_QObject)();
    local_30.mobj =
         (QMetaObject *)
         QMetaObjectPrivate::signal
                   (iVar3,(__sighandler_t)(ulong)*(uint *)&((pQVar2[1].d_ptr.d)->children).d.d);
    iVar3 = QMetaMethod::methodIndex(&local_30);
  }
LAB_002b66a3:
  LOCK();
  copy = (this_00->d_ptr)._q_value._M_b._M_p;
  (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(this_00,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int QObject::senderSignalIndex() const
{
    Q_D(const QObject);

    QMutexLocker locker(signalSlotLock(this));
    QObjectPrivate::ConnectionData *cd = d->connections.loadRelaxed();
    if (!cd || !cd->currentSender)
        return -1;

    for (QObjectPrivate::Connection *c = cd->senders; c; c = c->next) {
        if (c->sender == cd->currentSender->sender) {
            // Convert from signal range to method range
            return QMetaObjectPrivate::signal(c->sender->metaObject(), cd->currentSender->signal).methodIndex();
        }
    }

    return -1;
}